

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O3

void loadAET(EdgeTableEntry *AET,EdgeTableEntry *ETEs)

{
  EdgeTableEntry *pEVar1;
  EdgeTableEntry *pEVar2;
  EdgeTableEntry *pEVar3;
  EdgeTableEntry *pPrevAET;
  
  if (ETEs != (EdgeTableEntry *)0x0) {
    pEVar2 = AET->next;
    do {
      pEVar3 = ETEs;
      if (pEVar2 != (EdgeTableEntry *)0x0) {
        pEVar1 = pEVar2;
        do {
          pEVar2 = pEVar1;
          if ((pEVar3->bres).minor_axis <= (pEVar2->bres).minor_axis) {
            ETEs = pEVar3->next;
            pEVar3->next = pEVar2;
            pEVar2->back = pEVar3;
            goto LAB_0042e772;
          }
          pEVar1 = pEVar2->next;
          AET = pEVar2;
        } while (pEVar2->next != (_EdgeTableEntry *)0x0);
      }
      ETEs = pEVar3->next;
      pEVar3->next = (_EdgeTableEntry *)0x0;
      pEVar2 = (EdgeTableEntry *)0x0;
LAB_0042e772:
      pEVar3->back = AET;
      AET->next = pEVar3;
      AET = pEVar3;
    } while (ETEs != (_EdgeTableEntry *)0x0);
  }
  return;
}

Assistant:

static void loadAET(EdgeTableEntry *AET, EdgeTableEntry *ETEs)
{
    EdgeTableEntry *pPrevAET;
    EdgeTableEntry *tmp;

    pPrevAET = AET;
    AET = AET->next;
    while (ETEs) {
        while (AET && AET->bres.minor_axis < ETEs->bres.minor_axis) {
            pPrevAET = AET;
            AET = AET->next;
        }
        tmp = ETEs->next;
        ETEs->next = AET;
        if (AET)
            AET->back = ETEs;
        ETEs->back = pPrevAET;
        pPrevAET->next = ETEs;
        pPrevAET = ETEs;

        ETEs = tmp;
    }
}